

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tommyhashlin.c
# Opt level: O1

void tommy_hashlin_foreach(tommy_hashlin *hashlin,tommy_foreach_func *func)

{
  long lVar1;
  tommy_node_struct *ptVar2;
  uint uVar3;
  tommy_hashlin_node *ptVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar5 = hashlin->split + hashlin->low_max;
  if (uVar5 != 0) {
    uVar7 = 0;
    do {
      uVar6 = (uint)uVar7 | 1;
      uVar3 = 0x1f;
      if (uVar6 != 0) {
        for (; uVar6 >> uVar3 == 0; uVar3 = uVar3 - 1) {
        }
      }
      ptVar4 = hashlin->bucket[uVar3][uVar7];
      while (ptVar4 != (tommy_hashlin_node *)0x0) {
        ptVar2 = ptVar4->next;
        (*func)(ptVar4->data);
        ptVar4 = ptVar2;
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 != uVar5);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void tommy_hashlin_foreach(tommy_hashlin* hashlin, tommy_foreach_func* func)
{
	tommy_count_t bucket_max;
	tommy_count_t pos;

	/* number of valid buckets */
	bucket_max = hashlin->low_max + hashlin->split;

	for (pos = 0; pos < bucket_max; ++pos) {
		tommy_hashlin_node* node = *tommy_hashlin_pos(hashlin, pos);

		while (node) {
			void* data = node->data;
			node = node->next;
			func(data);
		}
	}
}